

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O0

int __thiscall ScalarEstimator::init(ScalarEstimator *this,EVP_PKEY_CTX *ctx)

{
  ScalarEstimator *pSVar1;
  uint local_14;
  int i;
  ScalarEstimator *this_local;
  
  (this->super_Estimator).nSamples = 0;
  this->dSample = 0.0;
  this->dOne = 0.0;
  this->dTwo = 0.0;
  this->dThree = 0.0;
  pSVar1 = this;
  if (this->aDist != (double *)0x0) {
    for (local_14 = 0; pSVar1 = (ScalarEstimator *)(ulong)local_14, (int)local_14 < this->nDist;
        local_14 = local_14 + 1) {
      this->aDist[(int)local_14] = 0.0;
    }
  }
  return (int)pSVar1;
}

Assistant:

void ScalarEstimator::init()
{
	nSamples = 0;
	dSample = 0.0;
	dOne = 0.0;
	dTwo = 0.0;
	dThree = 0.0;
	if(aDist)
		for(int i=0; i<nDist; i++)
			aDist[i] = 0.0;
}